

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O2

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::preprocess_subprograms
          (dwarf_resolver *this,die_object *cu_die,die_object *die,Dwarf_Half dwversion,
          vector<cpptrace::detail::libdwarf::subprogram_entry,_std::allocator<cpptrace::detail::libdwarf::subprogram_entry>_>
          *vec)

{
  function<bool_(const_cpptrace::detail::libdwarf::die_object_&)> local_50;
  anon_class_32_4_e8efa305 local_30;
  
  local_30.this = this;
  local_30.cu_die = cu_die;
  local_30.dwversion = dwversion;
  local_30.vec = vec;
  std::function<bool(cpptrace::detail::libdwarf::die_object_const&)>::
  function<cpptrace::detail::libdwarf::dwarf_resolver::preprocess_subprograms(cpptrace::detail::libdwarf::die_object_const&,cpptrace::detail::libdwarf::die_object_const&,unsigned_short,std::vector<cpptrace::detail::libdwarf::subprogram_entry,std::allocator<cpptrace::detail::libdwarf::subprogram_entry>>&)::_lambda(cpptrace::detail::libdwarf::die_object_const&)_1_,void>
            ((function<bool(cpptrace::detail::libdwarf::die_object_const&)> *)&local_50,&local_30);
  walk_die_list(die,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  return;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        void preprocess_subprograms(
            const die_object& cu_die,
            const die_object& die,
            Dwarf_Half dwversion,
            std::vector<subprogram_entry>& vec
        ) {
            walk_die_list(
                die,
                [this, &cu_die, dwversion, &vec] (const die_object& die) {
                    switch(die.get_tag()) {
                        case DW_TAG_subprogram:
                            {
                                auto ranges_vec = die.get_rangelist_entries(cu_die, dwversion);
                                // TODO: Feels super inefficient and some day should maybe use an interval tree.
                                for(auto range : ranges_vec) {
                                    // TODO: Reduce cloning here
                                    vec.push_back({ die.clone(), range.first, range.second });
                                }
                                // Walk children to get things like lambdas
                                // TODO: Somehow find a way to get better names here? For gcc it's just "operator()"
                                // On clang it's better
                                auto child = die.get_child();
                                if(child) {
                                    preprocess_subprograms(cu_die, child, dwversion, vec);
                                }
                            }
                            break;
                        case DW_TAG_namespace:
                        case DW_TAG_structure_type:
                        case DW_TAG_class_type:
                        case DW_TAG_module:
                        case DW_TAG_imported_module:
                        case DW_TAG_compile_unit:
                            {
                                auto child = die.get_child();
                                if(child) {
                                    preprocess_subprograms(cu_die, child, dwversion, vec);
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    return true;
                }
            );
            if(dump_dwarf) {
                std::fprintf(stderr, "End walk_die_list\n");
            }
        }